

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O1

char ** lua_rl_complete(char *text,int start,int end)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  lua_State *L;
  char **ppcVar4;
  size_t sVar5;
  size_t __n;
  int idx;
  int iVar6;
  ushort **ppuVar7;
  char *pcVar8;
  int suf;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  size_t __n_00;
  size_t local_70;
  dmlist local_58;
  long local_38;
  
  L = lua_rl_L;
  cVar2 = *text;
  if ((((long)cVar2 == 0) || (ppuVar7 = __ctype_b_loc(), cVar2 == '_')) ||
     (((*ppuVar7)[cVar2] & 0x400) != 0)) {
    local_58.allocated = 0;
    local_58.matchlen = 0;
    local_58.list = (char **)0x0;
    local_58.idx = 0;
    idx = lua_gettop(L);
    lua_pushvalue(L,-0x2712);
    __n_00 = (size_t)(end - start);
    if (end - start != 0) {
      lVar12 = __n_00 + (__n_00 == 0);
      local_70 = 0;
      lVar10 = 0;
      local_38 = lVar12;
LAB_001094b4:
      if ((text[lVar10] == ':') || (text[lVar10] == '.')) {
        uVar11 = 0x15;
        do {
          iVar6 = lua_type(L,-1);
          if (iVar6 == 5) {
            lua_pushlstring(L,text + local_70,lVar10 - local_70);
            lua_rawget(L,-2);
            iVar6 = lua_type(L,-1);
            if (iVar6 != 0) goto LAB_00109548;
            lua_settop(L,-2);
          }
          uVar11 = uVar11 - 1;
          if ((uVar11 < 2) || (iVar6 = lua_rl_getmetaindex(L), iVar6 == 0)) {
            lua_settop(L,-2);
            goto LAB_0010961f;
          }
        } while( true );
      }
      goto LAB_0010955c;
    }
    local_70 = 0;
LAB_001092a1:
    if (local_70 == 0) {
      pcVar9 = "and";
      lVar12 = 1;
      do {
        iVar6 = strncmp(pcVar9,text,__n_00);
        if ((iVar6 == 0) && (iVar6 = lua_rl_dmadd(&local_58,(char *)0x0,0,pcVar9,0x20), iVar6 != 0))
        goto LAB_0010961f;
        pcVar9 = lua_rl_keywords[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x16);
    }
    lVar12 = 0;
    do {
      iVar6 = lua_type(L,-1);
      if ((iVar6 == 5) && ((lVar12 == 0 || (iVar6 = lua_rawequal(L,-1,-0x2712), iVar6 == 0)))) {
        lua_pushnil(L);
        while (iVar6 = lua_next(L,-2), iVar6 != 0) {
          iVar6 = lua_type(L,-2);
          if (iVar6 == 4) {
            pcVar9 = lua_tolstring(L,-2,(size_t *)0x0);
            iVar6 = strncmp(pcVar9,text + local_70,__n_00 - local_70);
            if (iVar6 == 0) {
              ppuVar7 = __ctype_b_loc();
              cVar2 = *pcVar9;
              if (((long)cVar2 == 0x5f) || (((*ppuVar7)[cVar2] & 0x400) != 0)) {
                pcVar8 = pcVar9 + 1;
                do {
                  cVar3 = *pcVar8;
                  if ((long)cVar3 == 0) {
                    if ((cVar2 != '_') || (text[local_70] == '_')) {
                      iVar6 = lua_type(L,-1);
                      suf = 0x20;
                      if (iVar6 == 7) {
                        iVar6 = lua_getmetatable(L,-1);
                        if (iVar6 != 0) {
                          lua_settop(L,-2);
                          suf = 0x3a;
                        }
                      }
                      else if (iVar6 == 6) {
                        suf = 0x28;
                      }
                      else if (iVar6 == 5) {
                        suf = 0x2e;
                      }
                      iVar6 = lua_rl_dmadd(&local_58,text,local_70,pcVar9,suf);
                      if (iVar6 != 0) goto LAB_0010961f;
                    }
                    break;
                  }
                  pcVar8 = pcVar8 + 1;
                } while ((cVar3 == '_') || (((*ppuVar7)[cVar3] & 0xc00) != 0));
              }
            }
          }
          lua_settop(L,-2);
        }
      }
      if (lVar12 == 0x13) break;
      lVar12 = lVar12 + 1;
      iVar6 = lua_rl_getmetaindex(L);
    } while (iVar6 != 0);
    __n = local_58.matchlen;
    sVar5 = local_58.idx;
    if (local_58.idx != 0) {
      pcVar9 = (char *)malloc(local_58.matchlen + 1);
      ppcVar4 = local_58.list;
      *local_58.list = pcVar9;
      if (pcVar9 != (char *)0x0) {
        memcpy(pcVar9,local_58.list[1],__n);
        (*ppcVar4)[__n] = '\0';
        uVar1 = sVar5 + 1;
        if (uVar1 < local_58.allocated) {
LAB_001095f1:
          ppcVar4 = local_58.list;
          local_58.list[sVar5 + 1] = (char *)0x0;
          local_58.idx = uVar1;
          lua_settop(L,idx);
          _rl_completion_suppress_append = 1;
          return ppcVar4;
        }
        lVar12 = local_58.allocated * 8;
        local_58.allocated = local_58.allocated + 0x20;
        local_58.list = (char **)realloc(ppcVar4,lVar12 + 0x100);
        if (local_58.list != (char **)0x0) goto LAB_001095f1;
      }
    }
LAB_0010961f:
    lua_settop(L,idx);
  }
  return (char **)0x0;
LAB_00109548:
  lua_replace(L,-2);
  local_70 = lVar10 + 1;
  lVar12 = local_38;
LAB_0010955c:
  lVar10 = lVar10 + 1;
  if (lVar10 == lVar12) goto LAB_001092a1;
  goto LAB_001094b4;
}

Assistant:

static char **lua_rl_complete(const char *text, int start, int end)
{
  lua_State *L = lua_rl_L;
  dmlist ml;
  const char *s;
  size_t i, n, dot, loop;
  int savetop;

  if (!(text[0] == '\0' || isalpha(text[0]) || text[0] == '_')) return NULL;

  ml.list = NULL;
  ml.idx = ml.allocated = ml.matchlen = 0;

  savetop = lua_gettop(L);
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  for (n = (size_t)(end-start), i = dot = 0; i < n; i++)
    if (text[i] == '.' || text[i] == ':') {
      if (!lua_rl_getfield(L, text+dot, i-dot))
	goto error;  /* Invalid prefix. */
      dot = i+1;  /* Points to first char after dot/colon. */
    }

  /* Add all matches against keywords if there is no dot/colon. */
  if (dot == 0)
    for (i = 0; (s = lua_rl_keywords[i]) != NULL; i++)
      if (!strncmp(s, text, n) && lua_rl_dmadd(&ml, NULL, 0, s, ' '))
	goto error;

  /* Add all valid matches from all tables/metatables. */
  loop = 0;  /* Avoid infinite metatable loops. */
  do {
    if (lua_istable(L, -1) &&
	(loop == 0 || !lua_rawequal(L, -1, LUA_GLOBALSINDEX)))
      for (lua_pushnil(L); lua_next(L, -2); lua_pop(L, 1))
	if (lua_type(L, -2) == LUA_TSTRING) {
	  s = lua_tostring(L, -2);
	  /* Only match names starting with '_' if explicitly requested. */
	  if (!strncmp(s, text+dot, n-dot) && valididentifier(s) &&
	      (*s != '_' || text[dot] == '_')) {
	    int suf = ' ';  /* Default suffix is a space. */
	    switch (lua_type(L, -1)) {
	    case LUA_TTABLE:	suf = '.'; break;  /* No way to guess ':'. */
	    case LUA_TFUNCTION:	suf = '('; break;
	    case LUA_TUSERDATA:
	      if (lua_getmetatable(L, -1)) { lua_pop(L, 1); suf = ':'; }
	      break;
	    }
	    if (lua_rl_dmadd(&ml, text, dot, s, suf)) goto error;
	  }
	}
  } while (++loop < 20 && lua_rl_getmetaindex(L));

  if (ml.idx == 0) {
error:
    lua_settop(L, savetop);
    return NULL;
  } else {
    /* list[0] holds the common prefix of all matches (may be ""). */
    /* If there is only one match, list[0] and list[1] will be the same. */
    if (!(ml.list[0] = (char *)malloc(sizeof(char)*(ml.matchlen+1))))
      goto error;
    memcpy(ml.list[0], ml.list[1], ml.matchlen);
    ml.list[0][ml.matchlen] = '\0';
    /* Add the NULL list terminator. */
    if (lua_rl_dmadd(&ml, NULL, 0, NULL, 0)) goto error;
  }

  lua_settop(L, savetop);
#if RL_READLINE_VERSION >= 0x0600
  rl_completion_suppress_append = 1;
#endif
  return ml.list;
}